

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O1

void __thiscall QHostAddress::setScopeId(QHostAddress *this,QString *id)

{
  QHostAddressPrivate *pQVar1;
  
  pQVar1 = (this->d).d.ptr;
  if ((pQVar1 != (QHostAddressPrivate *)0x0) &&
     ((__atomic_base<int>)
      *(__int_type *)
       &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value != (__atomic_base<int>)0x1)) {
    QExplicitlySharedDataPointer<QHostAddressPrivate>::detach_helper(&this->d);
  }
  pQVar1 = (this->d).d.ptr;
  if (pQVar1->protocol == '\x01') {
    QString::operator=(&pQVar1->scopeId,(QString *)id);
    return;
  }
  return;
}

Assistant:

void QHostAddress::setScopeId(const QString &id)
{
    d.detach();
    if (d->protocol == QHostAddress::IPv6Protocol)
        d->scopeId = id;
}